

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicates_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::RemoveDuplicatesPass::Process(RemoveDuplicatesPass *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = RemoveDuplicateCapabilities(this);
  bVar2 = RemoveDuplicatesExtInstImports(this);
  bVar3 = RemoveDuplicateTypes(this);
  bVar4 = RemoveDuplicateDecorations(this);
  return ((bVar4 || bVar3) || (bVar2 || bVar1)) ^ SuccessWithoutChange;
}

Assistant:

Pass::Status RemoveDuplicatesPass::Process() {
  bool modified = RemoveDuplicateCapabilities();
  modified |= RemoveDuplicatesExtInstImports();
  modified |= RemoveDuplicateTypes();
  modified |= RemoveDuplicateDecorations();

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}